

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

Vec_Int_t * Dtt_ManCollect(Dtt_Man_t *p,uint Truth,Vec_Int_t *vFuns)

{
  int iVar1;
  uint local_48;
  word wStack_38;
  uint tTemp;
  word tCur;
  int local_28;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vFuns_local;
  uint Truth_local;
  Dtt_Man_t *p_local;
  
  wStack_38 = CONCAT44(Truth,Truth);
  Vec_IntClear(vFuns);
  for (Entry = 0; Entry < p->nPerms; Entry = Entry + 1) {
    for (local_28 = 0; local_28 < p->nComps; local_28 = local_28 + 1) {
      local_48 = (uint)wStack_38;
      if ((wStack_38 & p->CmpMask) != 0) {
        local_48 = local_48 ^ 0xffffffff;
      }
      iVar1 = Dtt_ManCheckHash(p,local_48);
      if (iVar1 != 0) {
        Vec_IntPush(vFuns,local_48);
      }
      wStack_38 = Abc_Tt6Flip(wStack_38,p->pComps[local_28]);
    }
    wStack_38 = Abc_Tt6SwapAdjacent(wStack_38,p->pPerms[Entry]);
  }
  if (wStack_38 == CONCAT44(Truth,Truth)) {
    for (Entry = 0; iVar1 = Vec_IntSize(p->vUsedBins), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p->vUsedBins,Entry);
      p->pBins[iVar1] = 0xffffffff;
    }
    Vec_IntClear(p->vUsedBins);
    return vFuns;
  }
  __assert_fail("tCur == (((word)Truth << 32) | (word)Truth)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                ,0x1fc,"Vec_Int_t *Dtt_ManCollect(Dtt_Man_t *, unsigned int, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Dtt_ManCollect( Dtt_Man_t * p, unsigned Truth, Vec_Int_t * vFuns )
{
    int i, k, Entry;
    word tCur = ((word)Truth << 32) | (word)Truth;
    Vec_IntClear( vFuns );
    for ( i = 0; i < p->nPerms; i++ )
    {
        for ( k = 0; k < p->nComps; k++ )
        {
//            unsigned tTemp = (unsigned)(tCur & 1 ? ~tCur : tCur);
            unsigned tTemp = (unsigned)(tCur & p->CmpMask ? ~tCur : tCur);
            if ( Dtt_ManCheckHash( p, tTemp ) )
                Vec_IntPush( vFuns, tTemp );
            tCur = Abc_Tt6Flip( tCur, p->pComps[k] );
        }
        tCur = Abc_Tt6SwapAdjacent( tCur, p->pPerms[i] );
    }
    assert( tCur == (((word)Truth << 32) | (word)Truth) );
    // clean hash table
    Vec_IntForEachEntry( p->vUsedBins, Entry, i )
        p->pBins[Entry] = ~0;
    Vec_IntClear( p->vUsedBins );
    //printf( "%d ", Vec_IntSize(vFuns) );
    return vFuns;
}